

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLatch.c
# Opt level: O0

void Abc_NtkTransformBack
               (Abc_Ntk_t *pNtkOld,Abc_Ntk_t *pNtkNew,Vec_Ptr_t *vControls,Vec_Int_t *vClasses)

{
  int iVar1;
  int iVar2;
  Abc_Obj_t *pAVar3;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *pAVar5;
  Abc_Obj_t *pObj_00;
  char *pData;
  int local_4c;
  int Class;
  int i;
  Abc_Obj_t *pDriver;
  Abc_Obj_t *pCtrl;
  Abc_Obj_t *pNodeNew;
  Abc_Obj_t *pObj;
  Vec_Int_t *vClasses_local;
  Vec_Ptr_t *vControls_local;
  Abc_Ntk_t *pNtkNew_local;
  Abc_Ntk_t *pNtkOld_local;
  
  iVar1 = Abc_NtkPoNum(pNtkOld);
  iVar2 = Abc_NtkPoNum(pNtkNew);
  if (iVar1 != iVar2) {
    __assert_fail("Abc_NtkPoNum(pNtkOld) == Abc_NtkPoNum(pNtkNew)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcLatch.c"
                  ,0x25b,
                  "void Abc_NtkTransformBack(Abc_Ntk_t *, Abc_Ntk_t *, Vec_Ptr_t *, Vec_Int_t *)");
  }
  for (local_4c = 0; iVar1 = Abc_NtkPoNum(pNtkOld), local_4c < iVar1; local_4c = local_4c + 1) {
    pAVar3 = Abc_NtkPo(pNtkOld,local_4c);
    pAVar4 = Abc_NtkPo(pNtkNew,local_4c);
    (pAVar3->field_6).pCopy = pAVar4;
  }
  local_4c = 0;
  while( true ) {
    iVar1 = Vec_PtrSize(vControls);
    if (iVar1 <= local_4c) {
      iVar1 = Abc_NtkLatchNum(pNtkNew);
      iVar2 = Vec_IntSize(vClasses);
      if (iVar1 == iVar2) {
        for (local_4c = 0; iVar1 = Vec_PtrSize(pNtkNew->vBoxes), local_4c < iVar1;
            local_4c = local_4c + 1) {
          pAVar3 = Abc_NtkBox(pNtkNew,local_4c);
          iVar1 = Abc_ObjIsLatch(pAVar3);
          if ((iVar1 != 0) && (iVar1 = Vec_IntEntry(vClasses,local_4c), iVar1 != -1)) {
            pAVar4 = Abc_ObjFanin0(pAVar3);
            pAVar4 = Abc_ObjFanin0(pAVar4);
            pAVar5 = (Abc_Obj_t *)Vec_PtrEntry(vControls,iVar1);
            pAVar5 = Abc_ObjFanin0(pAVar5);
            pObj_00 = Abc_NtkCreateNode(pNtkNew);
            Abc_ObjAddFanin(pObj_00,pAVar5);
            Abc_ObjAddFanin(pObj_00,pAVar4);
            pAVar5 = Abc_ObjFanout0(pAVar3);
            Abc_ObjAddFanin(pObj_00,pAVar5);
            pData = Abc_SopRegister((Mem_Flex_t *)pNtkNew->pManFunc,"0-1 1\n11- 1\n");
            Abc_ObjSetData(pObj_00,pData);
            pAVar3 = Abc_ObjFanin0(pAVar3);
            Abc_ObjPatchFanin(pAVar3,pAVar4,pObj_00);
          }
        }
        for (local_4c = 0; iVar1 = Vec_PtrSize(vControls), local_4c < iVar1; local_4c = local_4c + 1
            ) {
          pAVar3 = (Abc_Obj_t *)Vec_PtrEntry(vControls,local_4c);
          Abc_NtkDeleteObj(pAVar3);
        }
        return;
      }
      __assert_fail("Abc_NtkLatchNum(pNtkNew) == Vec_IntSize(vClasses)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcLatch.c"
                    ,0x266,
                    "void Abc_NtkTransformBack(Abc_Ntk_t *, Abc_Ntk_t *, Vec_Ptr_t *, Vec_Int_t *)")
      ;
    }
    pAVar3 = (Abc_Obj_t *)Vec_PtrEntry(vControls,local_4c);
    iVar1 = Abc_ObjIsPo(pAVar3);
    if ((iVar1 == 0) || (pAVar3->pNtk != pNtkOld)) break;
    Vec_PtrWriteEntry(vControls,local_4c,(pAVar3->field_6).pTemp);
    local_4c = local_4c + 1;
  }
  __assert_fail("Abc_ObjIsPo(pObj) && pObj->pNtk == pNtkOld",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcLatch.c"
                ,0x262,
                "void Abc_NtkTransformBack(Abc_Ntk_t *, Abc_Ntk_t *, Vec_Ptr_t *, Vec_Int_t *)");
}

Assistant:

void Abc_NtkTransformBack( Abc_Ntk_t * pNtkOld, Abc_Ntk_t * pNtkNew, Vec_Ptr_t * vControls, Vec_Int_t * vClasses )
{
    Abc_Obj_t * pObj, * pNodeNew, * pCtrl, * pDriver;
    int i, Class;
    assert( Abc_NtkPoNum(pNtkOld) == Abc_NtkPoNum(pNtkNew) );
    // match the POs of the old into new
    Abc_NtkForEachPo( pNtkOld, pObj, i )
        pObj->pCopy = Abc_NtkPo( pNtkNew, i );
    // remap the flops
    Vec_PtrForEachEntry( Abc_Obj_t *, vControls, pObj, i )
    {
        assert( Abc_ObjIsPo(pObj) && pObj->pNtk == pNtkOld );
        Vec_PtrWriteEntry( vControls, i, pObj->pCopy );
    }
    // create self-loops
    assert( Abc_NtkLatchNum(pNtkNew) == Vec_IntSize(vClasses) );
    Abc_NtkForEachLatch( pNtkNew, pObj, i )
    {
        Class = Vec_IntEntry( vClasses, i );
        if ( Class == -1 )
            continue;
        pDriver = Abc_ObjFanin0(Abc_ObjFanin0(pObj));
        pCtrl = (Abc_Obj_t *)Vec_PtrEntry( vControls, Class );
        pCtrl = Abc_ObjFanin0( pCtrl );
        pNodeNew = Abc_NtkCreateNode( pNtkNew );
        Abc_ObjAddFanin( pNodeNew, pCtrl );
        Abc_ObjAddFanin( pNodeNew, pDriver );
        Abc_ObjAddFanin( pNodeNew, Abc_ObjFanout0(pObj) );
        Abc_ObjSetData( pNodeNew, Abc_SopRegister((Mem_Flex_t *)pNtkNew->pManFunc, "0-1 1\n11- 1\n") );
        Abc_ObjPatchFanin( Abc_ObjFanin0(pObj), pDriver, pNodeNew );
    }
    // remove the useless POs
    Vec_PtrForEachEntry( Abc_Obj_t *, vControls, pObj, i )
        Abc_NtkDeleteObj( pObj );
}